

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

boolean findtravelpath(_func_boolean_int_int *guess,schar *dx,schar *dy)

{
  char cVar1;
  char cVar2;
  monst *worm;
  bool bVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  uint y0;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  obj *poVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  permonst *ptr;
  uint uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  uint local_3554;
  uint local_3534;
  uint (*local_3528) [21];
  char local_351c;
  ulong local_3508;
  uint travel [80] [21];
  xchar travelstepy [2] [1680];
  xchar travelstepx [2] [1680];
  
  if (((guess == (_func_boolean_int_int *)0x0) && (iflags.travel1 != '\0')) &&
     (iVar5 = distmin((int)u.ux,(int)u.uy,(int)u.tx,(int)u.ty), iVar5 == 1)) {
    flags.run = 0;
    bVar4 = test_move((int)u.ux,(int)u.uy,(int)u.tx - (int)u.ux,(int)u.ty - (int)u.uy,0,1);
    if (bVar4 != '\0') {
      *dx = u.tx - u.ux;
      *dy = u.ty - u.uy;
      nomul(0,(char *)0x0);
      iflags.travelcc.x = -1;
      iflags.travelcc.y = -1;
      return '\x01';
    }
    flags.run = 8;
  }
  if ((u.tx != u.ux) || (guess == unexplored || u.ty != u.uy)) {
    local_3554 = (uint)(byte)u.ux;
    if (guess == (_func_boolean_int_int *)0x0) {
      local_3554 = (uint)(byte)u.tx;
    }
    uVar17 = (ulong)(uint)(byte)u.uy;
    uVar6 = (uint)(byte)u.tx;
    uVar10 = (uint)(byte)u.ty;
    if (guess == (_func_boolean_int_int *)0x0) {
      uVar17 = (ulong)(byte)u.ty;
      uVar6 = (uint)(byte)u.ux;
      uVar10 = (uint)(byte)u.uy;
    }
    do {
      memset(travel,0,0x1a40);
      travelstepx[0][0] = (char)local_3554;
      travelstepy[0][0] = (char)uVar17;
      local_351c = (char)uVar6;
      uVar6 = (uint)local_351c;
      y0 = (uint)(char)uVar10;
      uVar15 = 1;
      uVar22 = 0;
      local_3508 = uVar15;
      while ((int)uVar15 != 0) {
        uVar13 = (uint)local_3508;
        uVar14 = (ulong)(1 - (int)uVar22);
        uVar12 = 0;
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        local_3534 = 0;
        for (; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          cVar1 = travelstepx[uVar22][uVar12];
          cVar2 = travelstepy[uVar22][uVar12];
          bVar23 = u.umonnum != 0x78;
          bVar3 = false;
          for (lVar16 = 0; (ulong)bVar23 * 0x10 + 0x10 != lVar16; lVar16 = lVar16 + 4) {
            iVar5 = (int)xdir[*(int *)((long)findtravelpath::ordered + lVar16)];
            if ((iVar5 + cVar1) - 1U < 0x4f) {
              iVar21 = (int)""[*(int *)((long)findtravelpath::ordered + lVar16)];
              uVar18 = iVar21 + cVar2;
              if (uVar18 < 0x15) {
                uVar7 = iVar5 + cVar1;
                if ((guess != couldsee_func) || ((viz_array[uVar18][uVar7] & 1U) != 0)) {
                  worm = level->monsters[uVar7][uVar18];
                  if ((worm == (monst *)0x0) ||
                     (uVar8 = *(uint *)&worm->field_0x60, (uVar8 >> 9 & 1) != 0)) {
LAB_001a2919:
                    bVar24 = false;
                  }
                  else {
                    if (worm->wormno == '\0') {
                      if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_001a2748;
                      if (u.uprops[0x1e].intrinsic == 0) {
                        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a26e9;
                        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a26e0;
                      }
                      else {
LAB_001a26e0:
                        if (ublindf == (obj *)0x0) goto LAB_001a2793;
LAB_001a26e9:
                        if (ublindf->oartifact != '\x1d') goto LAB_001a2793;
                      }
                      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                           (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                          ((viz_array[worm->my][worm->mx] & 1U) != 0)) &&
                         ((worm->data->mflags3 & 0x200) != 0)) goto LAB_001a2748;
LAB_001a2793:
                      if (((worm->data->mflags1 & 0x10000) == 0) &&
                         ((poVar11 = which_armor(worm,4), poVar11 == (obj *)0x0 ||
                          (poVar11 = which_armor(worm,4), poVar11->otyp != 0x4f)))) {
                        if (u.uprops[0x1e].intrinsic == 0) {
                          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a27ee;
                          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a27e9;
                        }
                        else {
LAB_001a27e9:
                          if (ublindf != (obj *)0x0) {
LAB_001a27ee:
                            if (ublindf->oartifact == '\x1d') goto LAB_001a2880;
                          }
                          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                          goto LAB_001a28df;
                        }
LAB_001a2880:
                        if ((u.uprops[0x19].extrinsic != 0) &&
                           ((u.uprops[0x19].blocked == 0 &&
                            (iVar9 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy),
                            iVar9 < 0x41)))) goto LAB_001a28df;
                      }
                      if ((u.uprops[0x42].intrinsic == 0) &&
                         ((u.uprops[0x42].extrinsic == 0 &&
                          (bVar4 = match_warn_of_mon(worm), bVar4 == '\0')))) goto LAB_001a2919;
                    }
                    else {
                      bVar4 = worm_known(level,worm);
                      if (bVar4 == '\0') goto LAB_001a2793;
                      uVar8 = *(uint *)&worm->field_0x60;
LAB_001a2748:
                      if ((((uVar8 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                         (u.uprops[0xc].extrinsic == 0)) {
                        if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                        goto LAB_001a2785;
                        goto LAB_001a2793;
                      }
                      if ((uVar8 & 0x280) != 0) goto LAB_001a2793;
LAB_001a2785:
                      if ((u._1052_1_ & 0x20) != 0) goto LAB_001a2793;
                    }
LAB_001a28df:
                    if (((byte)(worm->m_ap_type - 1) < 2) ||
                       ((ptr = worm->data, (ptr->mflags1 & 0x100) != 0 ||
                        ((char)*(uint *)&worm->field_0x60 < '\0')))) goto LAB_001a2919;
                    if ((*(uint *)&worm->field_0x60 >> 0x16 & 1) == 0) {
LAB_001a2905:
                      iVar9 = noattacks(ptr);
                      bVar24 = iVar9 != 0;
                    }
                    else {
                      bVar24 = true;
                      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                        if (u.umonnum != u.umonster) {
                          bVar4 = dmgtype(youmonst.data,0x24);
                          if (bVar4 != '\0') goto LAB_001a291c;
                          ptr = worm->data;
                        }
                        goto LAB_001a2905;
                      }
                    }
                  }
LAB_001a291c:
                  lVar20 = (long)(int)local_3534;
                  if ((((((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
                         (((youmonst.data)->mflags1 & 8) == 0)) &&
                        (bVar4 = can_ooze(&youmonst), bVar4 == '\0')) &&
                       (bVar4 = closed_door(level,uVar7,uVar18), bVar4 != '\0')) ||
                      ((poVar11 = sobj_at(0x214,level,uVar7,uVar18),
                       (bool)(poVar11 != (obj *)0x0 | bVar24) ||
                       (bVar4 = test_move((int)cVar1,(int)cVar2,iVar5,iVar21,0,3), bVar4 != '\0'))))
                     && ((int)(uVar13 - 5) < (int)travel[cVar1][cVar2])) {
                    if (bVar3) {
                      bVar3 = true;
                    }
                    else {
                      travelstepx[uVar14][lVar20] = cVar1;
                      travelstepy[uVar14][lVar20] = cVar2;
                      local_3534 = local_3534 + 1;
                      bVar3 = true;
                    }
                  }
                  else {
                    bVar4 = test_move((int)cVar1,(int)cVar2,iVar5,iVar21,0,3);
                    if ((bVar4 != '\0') ||
                       (bVar4 = test_move((int)cVar1,(int)cVar2,iVar5,iVar21,0,2), bVar4 != '\0')) {
                      if (level->locations[uVar7][uVar18].seenv == '\0') {
                        if (u.uprops[0x1e].intrinsic == 0) {
                          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a2ab2;
                          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a2aa9;
                        }
                        else {
LAB_001a2aa9:
                          if (ublindf == (obj *)0x0) goto LAB_001a2bb3;
LAB_001a2ab2:
                          if (ublindf->oartifact != '\x1d') goto LAB_001a2bb3;
                        }
                        if ((viz_array[uVar18][uVar7] & 1U) == 0) goto LAB_001a2bb3;
                      }
                      if ((uVar7 == uVar6) && (uVar18 == y0)) {
                        if (guess == (_func_boolean_int_int *)0x0) {
                          *dx = cVar1 - local_351c;
                          *dy = cVar2 - (char)uVar10;
                          if (cVar1 != u.tx) {
                            return '\x01';
                          }
                          if (cVar2 != u.ty) {
                            return '\x01';
                          }
                          nomul(0,(char *)0x0);
                          iflags.travelcc.x = -1;
                          iflags.travelcc.y = -1;
                          flags.run = 8;
                          return '\x01';
                        }
                      }
                      else if (travel[uVar7][uVar18] == 0) {
                        travelstepx[uVar14][lVar20] = (xchar)uVar7;
                        travelstepy[uVar14][lVar20] = (xchar)uVar18;
                        travel[uVar7][uVar18] = uVar13;
                        local_3534 = local_3534 + 1;
                      }
                    }
                  }
                }
              }
            }
LAB_001a2bb3:
          }
        }
        local_3508 = (ulong)(uVar13 + 1);
        uVar22 = uVar14;
        uVar15 = (ulong)local_3534;
      }
      if (guess == (_func_boolean_int_int *)0x0) {
        return '\0';
      }
      local_3554 = (uint)(char)local_3554;
      uVar13 = (uint)(char)uVar17;
      uVar10 = distmin(uVar6,y0,local_3554,uVar13);
      iVar5 = dist2(uVar6,y0,local_3554,uVar13);
      uVar17 = (ulong)uVar13;
      if (guess == unexplored) {
        iVar5 = 0x7fffffff;
        uVar10 = 0x7fffffff;
      }
      lVar20 = 0x13c;
      local_3528 = travel;
      for (lVar16 = 1; local_3528 = local_3528 + 1, lVar16 != 0x50; lVar16 = lVar16 + 1) {
        lVar19 = lVar20;
        for (uVar22 = 0; uVar22 != 0x15; uVar22 = uVar22 + 1) {
          uVar13 = (*local_3528)[uVar22];
          if (uVar13 != 0) {
            uVar7 = (uint)lVar16;
            iVar21 = (int)uVar22;
            uVar18 = distmin(uVar6,y0,uVar7,iVar21);
            if (guess == unexplored) {
              uVar8 = *(uint *)(level->levname + lVar19);
              uVar18 = uVar13;
              if (((uVar8 & 0x3f) != 0x26 && (uVar8 & 0x1ff800) == 0) &&
                 ((0x24 < (uVar8 & 0x3e) || ((0x1500000000U >> (uVar8 & 0x3e) & 1) == 0)))) {
                if (((uVar8 & 0x3f) - 0x1b < 2) ||
                   ((*(uint *)(level->levname + lVar19 + 6) & 0x3f0000) == 0)) {
                  uVar18 = uVar13 * 10;
                }
                else {
                  uVar18 = uVar13 * 2;
                }
              }
            }
            if ((uVar18 == uVar10) && (bVar4 = (*guess)(uVar7,iVar21), bVar4 != '\0')) {
              iVar21 = dist2(uVar6,y0,uVar7,iVar21);
              if (iVar21 < iVar5) {
                uVar17 = uVar22 & 0xffffffff;
                local_3554 = uVar7;
                iVar5 = iVar21;
              }
            }
            else if (((int)uVar18 < (int)uVar10) && (bVar4 = (*guess)(uVar7,iVar21), bVar4 != '\0'))
            {
              iVar5 = dist2(uVar6,y0,uVar7,iVar21);
              uVar17 = uVar22 & 0xffffffff;
              local_3554 = uVar7;
              uVar10 = uVar18;
            }
          }
          lVar19 = lVar19 + 0xc;
        }
        lVar20 = lVar20 + 0xfc;
      }
      uVar6 = (uint)u.ux;
      guess = (_func_boolean_int_int *)0x0;
      uVar10 = (uint)(byte)u.uy;
    } while ((local_3554 != uVar6) ||
            (guess = (_func_boolean_int_int *)0x0, (int)uVar17 != (int)u.uy));
    iVar5 = sgn((int)u.tx - local_3554);
    *dx = (schar)iVar5;
    uVar6 = sgn((int)u.ty - (int)u.uy);
    *dy = (char)uVar6;
    if ((*dx == '\0') && ((uVar6 & 0xff) == 0)) goto LAB_001a2fb4;
    bVar4 = test_move((int)u.ux,(int)u.uy,(int)*dx,(int)(char)uVar6,0,1);
    if (bVar4 != '\0') {
      return '\x01';
    }
  }
  *dx = '\0';
  *dy = '\0';
LAB_001a2fb4:
  nomul(0,(char *)0x0);
  return '\0';
}

Assistant:

static boolean findtravelpath(boolean (*guess)(int, int), schar *dx, schar *dy)
{
    /* if travel to adjacent, reachable location, use normal movement rules */
    if (!guess && iflags.travel1 && distmin(u.ux, u.uy, u.tx, u.ty) == 1) {
	flags.run = 0;
	if (test_move(u.ux, u.uy, u.tx-u.ux, u.ty-u.uy, 0, TEST_MOVE)) {
	    *dx = u.tx-u.ux;
	    *dy = u.ty-u.uy;
	    nomul(0, NULL);
	    iflags.travelcc.x = iflags.travelcc.y = -1;
	    return TRUE;
	}
	flags.run = 8;
    }
    if (u.tx != u.ux || u.ty != u.uy || guess == unexplored) {
	unsigned travel[COLNO][ROWNO];
	xchar travelstepx[2][COLNO*ROWNO];
	xchar travelstepy[2][COLNO*ROWNO];
	xchar tx, ty, ux, uy;
	int n = 1;			/* max offset in travelsteps */
	int set = 0;			/* two sets current and previous */
	int radius = 1;			/* search radius */
	int i;

	/* If guessing, first find an "obvious" goal location.  The obvious
	 * goal is the position the player knows of, or might figure out
	 * (couldsee) that is closest to the target on a straight path.
	 */
	if (guess) {
	    tx = u.ux; ty = u.uy; ux = u.tx; uy = u.ty;
	} else {
	    tx = u.tx; ty = u.ty; ux = u.ux; uy = u.uy;
	}

    noguess:
	memset(travel, 0, sizeof(travel));
	travelstepx[0][0] = tx;
	travelstepy[0][0] = ty;

	while (n != 0) {
	    int nn = 0;

	    for (i = 0; i < n; i++) {
		int dir;
		int x = travelstepx[set][i];
		int y = travelstepy[set][i];
		static const int ordered[] = { 0, 2, 4, 6, 1, 3, 5, 7 };
		/* no diagonal movement for grid bugs */
		int dirmax = u.umonnum == PM_GRID_BUG ? 4 : 8;
		boolean alreadyrepeated = FALSE;

		for (dir = 0; dir < dirmax; ++dir) {
		    const struct monst *mtmp;
		    boolean divert_mon;
		    int nx = x+xdir[ordered[dir]];
		    int ny = y+ydir[ordered[dir]];

		    /*
		     * When guessing and trying to travel as close as possible
		     * to an unreachable target space, don't include spaces
		     * that would never be picked as a guessed target in the
		     * travel matrix describing player-reachable spaces.
		     * This stops travel from getting confused and moving the
		     * player back and forth in certain degenerate configurations
		     * of sight-blocking obstacles, e.g.
		     *
		     *    T         1. Dig this out and carry enough to not be
		     *      ####       able to squeeze through diagonal gaps.
		     *      #--.---    Stand at @ and target travel at space T.
		     *       @.....
		     *       |.....
		     *
		     *    T         2. couldsee() marks spaces marked a and x as
		     *      ####       eligible guess spaces to move the player
		     *      a--.---    towards.  Space a is closest to T, so it gets
		     *       @xxxxx    chosen.  Travel system moves @ right to travel
		     *       |xxxxx    to space a.
		     *
		     *    T         3. couldsee() marks spaces marked b, c and x
		     *      ####       as eligible guess spaces to move the player
		     *      a--c---    towards.  Since findtravelpath() is called
		     *       b@xxxx    repeatedly during travel, it doesn't remember
		     *       |xxxxx    that it wanted to go to space a, so in
		     *                 comparing spaces b and c, b is chosen, since
		     *                 it seems like the closest eligible space to T.
		     *                 Travel system moves @ left to go to space b.
		     *
		     *              4. Go to 2.
		     *
		     * By limiting the travel matrix here, space a in the example
		     * above is never included in it, preventing the cycle.
		     */
		    if (!isok(nx, ny) || (guess == couldsee_func && !guess(nx, ny)))
			continue;

		    /* Walk around monsters that just get in the way. */
		    mtmp = m_at(level, nx, ny);
		    divert_mon = (mtmp &&
				  /* can be seen or spotted */
				  canspotmon(level, mtmp) &&
				  mtmp->m_ap_type != M_AP_FURNITURE &&
				  mtmp->m_ap_type != M_AP_OBJECT &&
				  !(is_hider(mtmp->data) || mtmp->mundetected) &&
				  /* peaceful monsters */
				  ((mtmp->mpeaceful && !Hallucination) ||
				   /* monsters with no attacks */
				   noattacks(mtmp->data)));

		    if ((!Passes_walls && !can_ooze(&youmonst) &&
			 closed_door(level, nx, ny)) ||
			sobj_at(BOULDER, level, nx, ny) ||
			divert_mon ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAP)) {
			/* closed doors and boulders usually
			 * cause a delay, so prefer another path */
			if ((int)travel[x][y] > radius-5) {
			    if (!alreadyrepeated) {
				travelstepx[1-set][nn] = x;
				travelstepy[1-set][nn] = y;
				/* don't change travel matrix! */
				nn++;
				alreadyrepeated = TRUE;
			    }
			    continue;
			}
		    }
		    if (test_move(x, y, nx-x, ny-y, 0, TEST_TRAP) ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAV)) {
			if (level->locations[nx][ny].seenv ||
			    (!Blind && couldsee(nx, ny))) {
			    if (nx == ux && ny == uy) {
				if (!guess) {
				    *dx = x-ux;
				    *dy = y-uy;
				    if (x == u.tx && y == u.ty) {
					nomul(0, NULL);
					/* reset run so domove run checks work */
					flags.run = 8;
					iflags.travelcc.x = iflags.travelcc.y = -1;
				    }
				    return TRUE;
				}
			    } else if (!travel[nx][ny]) {
				travelstepx[1-set][nn] = nx;
				travelstepy[1-set][nn] = ny;
				travel[nx][ny] = radius;
				nn++;
			    }
			}
		    }
		}
	    }

	    n = nn;
	    set = 1-set;
	    radius++;
	}

	/* if guessing, find best location in travel matrix and go there */
	if (guess) {
	    int px = tx, py = ty;	/* pick location */
	    int dist, nxtdist, d2, nd2;
	    boolean autoexploring = (guess == unexplored);

	    dist = distmin(ux, uy, tx, ty);
	    d2 = dist2(ux, uy, tx, ty);
	    if (autoexploring) {
		dist = INT_MAX;
		d2 = INT_MAX;
	    }
	    for (tx = 1; tx < COLNO; ++tx) {
		for (ty = 0; ty < ROWNO; ++ty) {
		    if (travel[tx][ty]) {
			nxtdist = distmin(ux, uy, tx, ty);
			if (autoexploring)
			    nxtdist = autotravel_weighting(tx, ty, travel[tx][ty]);
			if (nxtdist == dist && guess(tx, ty)) {
			    nd2 = dist2(ux, uy, tx, ty);
			    if (nd2 < d2) {
				/* prefer non-zigzag path */
				px = tx; py = ty;
				d2 = nd2;
			    }
			} else if (nxtdist < dist && guess(tx, ty)) {
			    px = tx; py = ty;
			    dist = nxtdist;
			    d2 = dist2(ux, uy, tx, ty);
			}
		    }
		}
	    }

	    if (px == u.ux && py == u.uy) {
		/* no guesses, just go in the general direction */
		*dx = sgn(u.tx - u.ux);
		*dy = sgn(u.ty - u.uy);
		if (*dx == 0 && *dy == 0) {
		    nomul(0, NULL);
		    return FALSE;
		}
		if (test_move(u.ux, u.uy, *dx, *dy, 0, TEST_MOVE))
		    return TRUE;
		goto found;
	    }
	    tx = px;
	    ty = py;
	    ux = u.ux;
	    uy = u.uy;
	    set = 0;
	    n = radius = 1;
	    guess = NULL;
	    goto noguess;
	}
	return FALSE;
    }

found:
    *dx = 0;
    *dy = 0;
    nomul(0, NULL);
    return FALSE;
}